

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O2

int cpu_breakpoint_remove_riscv64(CPUState *cpu,vaddr pc,int flags)

{
  CPUBreakpoint *breakpoint;
  anon_union_16_2_aaf24f3d_for_entry *paVar1;
  
  paVar1 = (anon_union_16_2_aaf24f3d_for_entry *)&cpu->breakpoints;
  while( true ) {
    breakpoint = paVar1->tqe_next;
    if (breakpoint == (CPUBreakpoint *)0x0) {
      return -2;
    }
    if ((breakpoint->pc == pc) && (breakpoint->flags == flags)) break;
    paVar1 = &breakpoint->entry;
  }
  cpu_breakpoint_remove_by_ref_riscv64(cpu,breakpoint);
  return 0;
}

Assistant:

int cpu_breakpoint_remove(CPUState *cpu, vaddr pc, int flags)
{
    CPUBreakpoint *bp;

    QTAILQ_FOREACH(bp, &cpu->breakpoints, entry) {
        if (bp->pc == pc && bp->flags == flags) {
            cpu_breakpoint_remove_by_ref(cpu, bp);
            return 0;
        }
    }
    return -ENOENT;
}